

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O1

void __thiscall ui::Led::Led(Led *this,string *name)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  ConstStringListRef entries;
  Ref<ftxui::ButtonOption> option;
  Ref<ftxui::ButtonOption> option_00;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_00;
  allocator_type local_272;
  allocator_type local_271;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  Component local_268;
  shared_ptr<ftxui::ComponentBase> local_258;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  shared_ptr<ftxui::ComponentBase> local_228;
  element_type *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  Container local_208 [16];
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_1f8;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_1e0;
  Led *local_1c8;
  undefined8 uStack_1c0;
  code *local_1b8;
  code *pcStack_1b0;
  Led *local_1a8;
  undefined8 uStack_1a0;
  code *local_198;
  code *pcStack_190;
  ConstStringRef local_188;
  ConstStringRef local_160;
  _Any_data local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Any_data local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined4 *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  uint uStack_b4;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  code *pcStack_90;
  code *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ComponentBase).parent_ = (ComponentBase *)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Led_00174568;
  local_270 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)local_270;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  std::operator+(&this->file_path_,"/sys/class/leds/",name);
  this->brightness_ = 0;
  this->period_ = 0x14;
  this->ratio_ = 0.5;
  (this->trigger_)._M_dataplus._M_p = (pointer)&(this->trigger_).field_2;
  (this->trigger_)._M_string_length = 0;
  (this->trigger_).field_2._M_local_buf[0] = '\0';
  this->trigger_selected_ = 0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = 0x208997e2;
  local_e0 = 4;
  uStack_d4 = uStack_d4 & 0xffffff00;
  local_b8 = 0x208b97e2;
  local_c0 = 4;
  uStack_b4 = uStack_b4 & 0xffffff00;
  uStack_a0 = 0;
  local_a8 = ftxui::inverted;
  pcStack_90 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  uStack_80 = 0;
  local_88 = ftxui::nothing;
  pcStack_70 = std::
               _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(),_ftxui::RadioboxOption::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/include/ftxui/component/component_options.hpp:70:37)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_ftxui::RadioboxOption::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/build_O1/_deps/ftxui-src/include/ftxui/component/component_options.hpp:70:37)>
             ::_M_manager;
  local_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)&this->trigger_entries_;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->trigger_list_;
  local_e8 = &local_d8;
  local_c8 = &local_b8;
  ftxui::Radiobox(entries,(int *)0x0,(Ref<ftxui::RadioboxOption> *)&this->trigger_selected_);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,3);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT44(uStack_b4,local_b8) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT44(uStack_d4,local_d8) + 1);
  }
  ftxui::ConstStringRef::ConstStringRef((ConstStringRef *)&local_110,"Toggle");
  uStack_1a0 = 0;
  pcStack_190 = std::
                _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:132:47)>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:132:47)>
              ::_M_manager;
  option.address_ = (ButtonOption *)0x1;
  option._0_8_ = &local_1a8;
  local_1a8 = this;
  ftxui::Button((ConstStringRef *)&this->button_toggle_,(function<void_()> *)&local_110,option);
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_unused._0_8_ != &local_100) {
    operator_delete(local_110._M_unused._M_object,local_100._M_allocated_capacity + 1);
  }
  ftxui::ConstStringRef::ConstStringRef((ConstStringRef *)&local_138,"Trigger on timer ");
  uStack_1c0 = 0;
  pcStack_1b0 = std::
                _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:134:35)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:134:35)>
              ::_M_manager;
  option_00.address_ = (ButtonOption *)0x1;
  option_00._0_8_ = &local_1c8;
  local_1c8 = this;
  ftxui::Button((ConstStringRef *)&this->button_trigger_timer_,(function<void_()> *)&local_138,
                option_00);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_unused._0_8_ != &local_128) {
    operator_delete(local_138._M_unused._M_object,local_128._M_allocated_capacity + 1);
  }
  ftxui::ConstStringRef::ConstStringRef(&local_160,"Period      :");
  ftxui::Slider<int>((ftxui *)&this->slider_period_,&local_160,&this->period_,0,2000,0x32);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.owned_._M_dataplus._M_p != &local_160.owned_.field_2) {
    operator_delete(local_160.owned_._M_dataplus._M_p,
                    local_160.owned_.field_2._M_allocated_capacity + 1);
  }
  ftxui::ConstStringRef::ConstStringRef(&local_188,"Ratio ON/OFF:");
  ftxui::Slider<float>((ftxui *)&this->slider_delay,&local_188,&this->ratio_,0.0,1.0,0.05);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.owned_._M_dataplus._M_p != &local_188.owned_.field_2) {
    operator_delete(local_188.owned_._M_dataplus._M_p,
                    local_188.owned_.field_2._M_allocated_capacity + 1);
  }
  FetchState(this);
  local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->trigger_list_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->trigger_list_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_228.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_218 = (this->button_toggle_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_210 = (this->button_toggle_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_210->_M_use_count = local_210->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_210->_M_use_count = local_210->_M_use_count + 1;
    }
  }
  local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->slider_period_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->slider_period_).super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_258.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_248 = (this->slider_delay).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_240 = (this->slider_delay).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_240->_M_use_count = local_240->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_240->_M_use_count = local_240->_M_use_count + 1;
    }
  }
  local_238 = (this->button_trigger_timer_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_230 = (this->button_trigger_timer_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_230->_M_use_count = local_230->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_230->_M_use_count = local_230->_M_use_count + 1;
    }
  }
  __l._M_len = 3;
  __l._M_array = &local_258;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_1f8,__l,&local_271);
  ftxui::Container::Vertical(local_208,&local_1f8);
  __l_00._M_len = 3;
  __l_00._M_array = &local_228;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_1e0,__l_00,&local_272);
  ftxui::Container::Vertical((Container *)&local_268,&local_1e0);
  ftxui::ComponentBase::Add(&this->super_ComponentBase,&local_268);
  if (local_268.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_1e0);
  lVar2 = 0x30;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_230 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&local_230 + lVar2));
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_1f8);
  lVar2 = 0x30;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_268.
                       super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + lVar2);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  return;
}

Assistant:

Led(std::string name) : name_(name), file_path_("/sys/class/leds/" + name) {
    FetchState();

    Add(Container::Vertical({
        trigger_list_,
        button_toggle_,
        Container::Vertical({
            slider_period_,
            slider_delay,
            button_trigger_timer_,
        }),
    }));
  }